

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::Repeat<char>,char_const*&,char_const(&)[2],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String,char>
          (String *__return_storage_ptr__,kj *this,Repeat<char> *params,char **params_1,
          char (*params_2) [2],int *params_3,char (*params_4) [3],LogSeverity *params_5,
          char (*params_6) [3],String *params_7,char *params_8)

{
  Repeat<char> *value;
  char **value_00;
  char (*value_01) [2];
  kj *this_00;
  char (*pacVar1) [3];
  LogSeverity *value_02;
  String *value_03;
  char *value_04;
  int *value_05;
  Repeat<char> RVar2;
  FixedArray<char,_1UL> *in_stack_ffffffffffffff18;
  char local_c9 [1];
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  CappedArray<char,_14UL> local_88;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  _ local_50 [8];
  size_t local_48;
  char (*local_40) [3];
  char (*params_local_4) [3];
  int *params_local_3;
  char (*params_local_2) [2];
  char **params_local_1;
  Repeat<char> *params_local;
  
  local_40 = (char (*) [3])params_3;
  params_local_4 = (char (*) [3])params_2;
  params_local_3 = (int *)params_1;
  params_local_2 = &params->value;
  params_local_1 = (char **)this;
  params_local = (Repeat<char> *)__return_storage_ptr__;
  value = fwd<kj::Repeat<char>>((NoInfer<kj::Repeat<char>_> *)this);
  RVar2 = toCharSequence<kj::Repeat<char>>(value);
  local_48 = RVar2.count;
  local_50[0] = (_)RVar2.value;
  value_00 = fwd<char_const*&>((char **)params_local_2);
  local_60 = toCharSequence<char_const*&>(value_00);
  value_01 = ::const((char (*) [2])params_local_3);
  local_70 = toCharSequence<char_const(&)[2]>(value_01);
  this_00 = (kj *)fwd<int&>((int *)params_local_4);
  toCharSequence<int&>(&local_88,this_00,value_05);
  pacVar1 = ::const(local_40);
  local_98 = toCharSequence<char_const(&)[3]>(pacVar1);
  value_02 = fwd<kj::LogSeverity&>((LogSeverity *)params_4);
  local_a8 = (ArrayPtr<const_char>)toCharSequence<kj::LogSeverity&>(value_02);
  pacVar1 = ::const((char (*) [3])params_5);
  local_b8 = toCharSequence<char_const(&)[3]>(pacVar1);
  value_03 = fwd<kj::String>((NoInfer<kj::String> *)params_6);
  local_c8 = toCharSequence<kj::String>(value_03);
  value_04 = fwd<char>((NoInfer<char> *)params_7);
  local_c9[0] = (char)toCharSequence<char>(value_04);
  _::
  concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,local_50,(Repeat<char> *)&local_60,&local_70,
             (ArrayPtr<const_char> *)&local_88,(CappedArray<char,_14UL> *)&local_98,&local_a8,
             (StringPtr *)&local_b8,&local_c8,(ArrayPtr<const_char> *)local_c9,
             in_stack_ffffffffffffff18);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}